

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QWizard::setOptions(QWizard *this,WizardOptions options)

{
  QFlagsStorageHelper<QWizard::WizardOption,_4> QVar1;
  QWizardPrivate *this_00;
  uint uVar2;
  
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QVar1.super_QFlagsStorage<QWizard::WizardOption>.i =
       (QFlagsStorage<QWizard::WizardOption>)
       (this_00->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
       super_QFlagsStorage<QWizard::WizardOption>.i;
  if (QVar1.super_QFlagsStorage<QWizard::WizardOption>.i ==
      (QFlagsStorage<QWizard::WizardOption>)
      options.super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
      super_QFlagsStorage<QWizard::WizardOption>.i) {
    return;
  }
  uVar2 = (uint)QVar1.super_QFlagsStorage<QWizard::WizardOption>.i ^
          (uint)options.super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                super_QFlagsStorage<QWizard::WizardOption>.i;
  QWizardPrivate::disableUpdates(this_00);
  (this_00->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
  super_QFlagsStorage<QWizard::WizardOption>.i =
       (Int)options.super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
            super_QFlagsStorage<QWizard::WizardOption>.i;
  if ((((uint)options.super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
              super_QFlagsStorage<QWizard::WizardOption>.i & 1) == 0) && ((uVar2 & 1) != 0)) {
    QWizardPrivate::cleanupPagesNotInHistory(this_00);
  }
  if ((uVar2 & 0xfe08) == 0) {
    if ((uVar2 & 0x101f0) != 0) {
      QWizardPrivate::_q_updateButtonStates(this_00);
    }
  }
  else {
    QWizardPrivate::updateButtonLayout(this_00);
  }
  QWizardPrivate::enableUpdates(this_00);
  QWizardPrivate::updateLayout(this_00);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }